

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
wabt::MakeUnique<wabt::AssertReturnCommand>(void)

{
  AssertReturnCommand *this;
  __uniq_ptr_data<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>,_true,_true>
  in_RDI;
  
  this = (AssertReturnCommand *)operator_new(0x30);
  memset(this,0,0x30);
  AssertReturnCommand::AssertReturnCommand(this);
  std::unique_ptr<wabt::AssertReturnCommand,std::default_delete<wabt::AssertReturnCommand>>::
  unique_ptr<std::default_delete<wabt::AssertReturnCommand>,void>
            ((unique_ptr<wabt::AssertReturnCommand,std::default_delete<wabt::AssertReturnCommand>> *
             )in_RDI.
              super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
              ._M_t.
              super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
              .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl,this);
  return (__uniq_ptr_data<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>,_true,_true>
          )(tuple<wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>)
           in_RDI.
           super___uniq_ptr_impl<wabt::AssertReturnCommand,_std::default_delete<wabt::AssertReturnCommand>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::AssertReturnCommand_*,_std::default_delete<wabt::AssertReturnCommand>_>
           .super__Head_base<0UL,_wabt::AssertReturnCommand_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}